

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_TagBox.cpp
# Opt level: O0

void __thiscall
amrex::TagBoxArray::TagBoxArray
          (TagBoxArray *this,BoxArray *ba,DistributionMapping *dm,IntVect *_ngrow)

{
  MFInfo *in_RDI;
  IntVect *unaff_retaddr;
  int in_stack_0000000c;
  DistributionMapping *in_stack_00000010;
  BoxArray *in_stack_00000018;
  FabArray<amrex::TagBox> *in_stack_00000020;
  FabFactory<amrex::TagBox> *in_stack_00000030;
  FabArray<amrex::TagBox> *this_00;
  value_type val;
  FabArray<amrex::TagBox> *this_01;
  _func_int **local_50;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  undefined8 uStack_30;
  undefined8 local_28;
  undefined8 info;
  
  local_38 = 0;
  uStack_30 = 0;
  local_48 = 0;
  uStack_40 = 0;
  local_28 = 0;
  info = in_RDI;
  MFInfo::MFInfo((MFInfo *)0x135f99a);
  local_50 = (_func_int **)0x0;
  this_00 = (FabArray<amrex::TagBox> *)&stack0xffffffffffffffb0;
  DefaultFabFactory<amrex::TagBox>::DefaultFabFactory((DefaultFabFactory<amrex::TagBox> *)this_00);
  this_01 = this_00;
  FabArray<amrex::TagBox>::FabArray
            (in_stack_00000020,in_stack_00000018,in_stack_00000010,in_stack_0000000c,unaff_retaddr,
             (MFInfo *)info,in_stack_00000030);
  val = (value_type)((ulong)this_00 >> 0x38);
  DefaultFabFactory<amrex::TagBox>::~DefaultFabFactory
            ((DefaultFabFactory<amrex::TagBox> *)0x135f9ec);
  MFInfo::~MFInfo((MFInfo *)0x135f9f6);
  *(undefined ***)in_RDI = &PTR__TagBoxArray_01aa47e8;
  FabArray<amrex::TagBox>::setVal<amrex::TagBox,_0>(this_01,val);
  return;
}

Assistant:

TagBoxArray::TagBoxArray (const BoxArray& ba,
                          const DistributionMapping& dm,
                          const IntVect&  _ngrow)
    :
    FabArray<TagBox>(ba,dm,1,_ngrow,MFInfo(),DefaultFabFactory<TagBox>())
{
    setVal(TagBox::CLEAR);
}